

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O3

void __thiscall mognetwork::TcpSocket::disconnect(TcpSocket *this)

{
  int in_ESI;
  ReadedDatas local_38;
  
  Socket::close(&this->super_Socket,in_ESI);
  std::__cxx11::
  list<std::vector<char,std::allocator<char>>*,std::allocator<std::vector<char,std::allocator<char>>*>>
  ::remove_if<bool(*)(std::vector<char,std::allocator<char>>*)>
            ((list<std::vector<char,std::allocator<char>>*,std::allocator<std::vector<char,std::allocator<char>>*>>
              *)&this->m_pendingDatas,deleteAll);
  ReadedDatas::ReadedDatas(&local_38);
  (this->m_pendingRDatas).totalSize = local_38.totalSize;
  (this->m_pendingRDatas).readed = local_38.readed;
  std::vector<char,_std::allocator<char>_>::operator=
            (&(this->m_pendingRDatas).datas,&local_38.datas);
  if (local_38.datas.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.datas.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TcpSocket::disconnect()
  {
    close();
    m_pendingDatas.remove_if(deleteAll);
    m_pendingRDatas = ReadedDatas();
  }